

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_dispel_evil(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *format;
  
  bVar1 = is_npc(ch);
  if (!bVar1) {
    bVar1 = is_evil(ch);
    if (bVar1) {
      vo = ch;
    }
  }
  bVar1 = is_good((CHAR_DATA *)vo);
  if (bVar1) {
    format = "$N is protected.";
    iVar2 = 0;
  }
  else {
    bVar1 = is_neutral((CHAR_DATA *)vo);
    if (!bVar1) {
      iVar2 = dice(level,4);
      bVar1 = saves_spell(level,(CHAR_DATA *)vo,10);
      if (bVar1) {
        iVar2 = iVar2 / 2;
      }
      damage_old(ch,(CHAR_DATA *)vo,iVar2,sn,10,true);
      return;
    }
    format = "$N does not seem to be affected.";
    iVar2 = 3;
  }
  act(format,ch,(void *)0x0,vo,iVar2);
  return;
}

Assistant:

void spell_dispel_evil(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	if (!is_npc(ch) && is_evil(ch))
		victim = ch;

	if (is_good(victim))
	{
		act("$N is protected.", ch, nullptr, victim, TO_ROOM);
		return;
	}

	if (is_neutral(victim))
	{
		act("$N does not seem to be affected.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	dam = dice(level, 4);

	if (saves_spell(level, victim, DAM_HOLY))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_HOLY, true);
}